

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerCoreTemplate.cc
# Opt level: O1

uint8_t * __thiscall PowerCore::fetchBlock(PowerCore *this,uint32_t blockAddr)

{
  ulong uVar1;
  uint uVar2;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  uint32_t uVar10;
  _Hash_node_base *p_Var11;
  ostream *poVar12;
  byte bVar13;
  byte bVar14;
  uchar uVar15;
  ushort uVar16;
  uint uVar17;
  void *pvVar18;
  byte bVar19;
  ulong uVar20;
  uint uVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  bool bVar26;
  uint uVar27;
  uint uVar28;
  __node_base_ptr p_Var29;
  __node_base_ptr p_Var30;
  byte bVar31;
  undefined2 uVar32;
  uint uVar33;
  uint uVar34;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var35;
  uint32_t addr;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>,_bool>
  pVar44;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  void **opcodes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_58;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  uint local_4c;
  undefined1 local_46;
  undefined1 local_45;
  uint local_44;
  undefined1 local_3d;
  uint32_t local_3c;
  void **local_38;
  uint uVar3;
  
  uVar1 = (this->blocks)._M_h._M_bucket_count;
  uVar20 = (ulong)blockAddr % uVar1;
  p_Var29 = (this->blocks)._M_h._M_buckets[uVar20];
  p_Var30 = (__node_base_ptr)0x0;
  if ((p_Var29 != (__node_base_ptr)0x0) &&
     (p_Var11 = p_Var29->_M_nxt, p_Var30 = p_Var29,
     *(uint32_t *)&p_Var29->_M_nxt[1]._M_nxt != blockAddr)) {
    while (p_Var29 = p_Var11, p_Var11 = p_Var29->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
      p_Var30 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var11[1]._M_nxt % uVar1 != uVar20) ||
         (p_Var30 = p_Var29, *(uint *)&p_Var11[1]._M_nxt == blockAddr)) goto LAB_0010d585;
    }
    p_Var30 = (__node_base_ptr)0x0;
  }
LAB_0010d585:
  if (p_Var30 == (__node_base_ptr)0x0) {
    p_Var11 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var11 = p_Var30->_M_nxt;
  }
  if (p_Var11 == (_Hash_node_base *)0x0) {
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3c = blockAddr;
    if (this->getNextBreakpoint == (_func_uint32_t_uint32_t *)0x0) {
      uVar10 = 0xffffffff;
    }
    else {
      uVar10 = (*this->getNextBreakpoint)(blockAddr);
    }
    interpret2(this,&local_38);
    p_Var35 = (_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)&this->blocks;
    addr = local_3c;
    do {
      if (addr == uVar10) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_78,
                   (size_type)
                   (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_78.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        *(void **)(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -0x10) = local_38[-1];
        *(uint32_t *)
         (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish + -8) = addr;
        uVar10 = (*this->getNextBreakpoint)(addr + 4);
      }
      uVar34 = *(uint *)((long)this->memoryBases[addr >> 0x1e] + (ulong)addr);
      uVar25 = uVar34 >> 0x18;
      uVar28 = (uVar34 & 0xff0000) >> 8;
      uVar2 = uVar25 | uVar28;
      uVar4 = (uVar34 & 0xff00) << 8;
      uVar3 = uVar2 | uVar4;
      uVar24 = uVar34 << 0x18;
      uVar33 = uVar3 | uVar24;
      uVar17 = uVar33 & 0xfc0007ff;
      bVar14 = (byte)((uVar34 & 0xff00) >> 8);
      if (uVar17 == 0x7c000614) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_78,
                   (size_type)
                   (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_78.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar31 = (byte)(uVar33 >> 0xb);
        bVar13 = (byte)(uVar33 >> 0x15);
        pvVar18 = *local_38;
LAB_0010d8fe:
        *(void **)(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish[-8] = bVar13 & 0x1f;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish[-7] = bVar14 & 0x1f;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish[-6] = bVar31 & 0x1f;
LAB_0010d916:
        addr = addr + 4;
        bVar26 = true;
      }
      else {
        if (uVar17 == 0x7c000215) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_78,
                     (size_type)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar31 = (byte)(uVar33 >> 0xb);
          bVar13 = (byte)(uVar33 >> 0x15);
          pvVar18 = local_38[1];
          goto LAB_0010d8fe;
        }
        if (uVar17 == 0x7c000615) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_78,
                     (size_type)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar31 = (byte)(uVar33 >> 0xb);
          bVar13 = (byte)(uVar33 >> 0x15);
          pvVar18 = local_38[2];
          goto LAB_0010d8fe;
        }
        if (uVar17 == 0x7c000214) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_78,
                     (size_type)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar31 = (byte)(uVar33 >> 0xb);
          bVar13 = (byte)(uVar33 >> 0x15);
          pvVar18 = local_38[3];
          goto LAB_0010d8fe;
        }
        if (uVar17 == 0x7c000414) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_78,
                     (size_type)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar31 = (byte)(uVar33 >> 0xb);
          bVar13 = (byte)(uVar33 >> 0x15);
          pvVar18 = local_38[4];
          goto LAB_0010d8fe;
        }
        if (uVar17 == 0x7c000015) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_78,
                     (size_type)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar31 = (byte)(uVar33 >> 0xb);
          bVar13 = (byte)(uVar33 >> 0x15);
          pvVar18 = local_38[5];
          goto LAB_0010d8fe;
        }
        if (uVar17 == 0x7c000415) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_78,
                     (size_type)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar31 = (byte)(uVar33 >> 0xb);
          bVar13 = (byte)(uVar33 >> 0x15);
          pvVar18 = local_38[6];
          goto LAB_0010d8fe;
        }
        if (uVar17 == 0x7c000014) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_78,
                     (size_type)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar31 = (byte)(uVar33 >> 0xb);
          bVar13 = (byte)(uVar33 >> 0x15);
          pvVar18 = local_38[7];
          goto LAB_0010d8fe;
        }
        if (uVar17 == 0x7c000514) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_78,
                     (size_type)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar31 = (byte)(uVar33 >> 0xb);
          bVar13 = (byte)(uVar33 >> 0x15);
          pvVar18 = local_38[8];
          goto LAB_0010d8fe;
        }
        if (uVar17 == 0x7c000115) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_78,
                     (size_type)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar31 = (byte)(uVar33 >> 0xb);
          bVar13 = (byte)(uVar33 >> 0x15);
          pvVar18 = local_38[9];
          goto LAB_0010d8fe;
        }
        if (uVar17 == 0x7c000515) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_78,
                     (size_type)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar31 = (byte)(uVar33 >> 0xb);
          bVar13 = (byte)(uVar33 >> 0x15);
          pvVar18 = local_38[10];
          goto LAB_0010d8fe;
        }
        if (uVar17 == 0x7c000114) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_78,
                     (size_type)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar31 = (byte)(uVar33 >> 0xb);
          bVar13 = (byte)(uVar33 >> 0x15);
          pvVar18 = local_38[0xb];
          goto LAB_0010d8fe;
        }
        if (uVar17 != 0x7c000714) {
          if (uVar17 == 0x7c000315) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_78,
                       (size_type)
                       (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            bVar31 = (byte)(uVar33 >> 0xb);
            bVar13 = (byte)(uVar33 >> 0x15);
            pvVar18 = local_38[0xd];
            goto LAB_0010da0a;
          }
          if (uVar17 == 0x7c000715) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_78,
                       (size_type)
                       (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            bVar31 = (byte)(uVar33 >> 0xb);
            bVar13 = (byte)(uVar33 >> 0x15);
            pvVar18 = local_38[0xe];
            goto LAB_0010da0a;
          }
          if (uVar17 == 0x7c000314) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_78,
                       (size_type)
                       (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            bVar31 = (byte)(uVar33 >> 0xb);
            bVar13 = (byte)(uVar33 >> 0x15);
            pvVar18 = local_38[0xf];
            goto LAB_0010da0a;
          }
          uVar7 = uVar24 & 0xfc000000;
          uVar32 = (undefined2)uVar2;
          if (uVar7 == 0x3c000000) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_78,
                       (size_type)
                       (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            *(void **)(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -0x10) = local_38[0x10];
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish[-6] = (byte)(uVar33 >> 0x15) & 0x1f;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish[-5] = bVar14 & 0x1f;
            *(undefined2 *)
             (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish + -8) = uVar32;
            goto LAB_0010d916;
          }
          local_58 = p_Var35;
          if (uVar7 != 0x38000000) {
            if (uVar7 == 0x34000000) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_78,
                         (size_type)
                         (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_78.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar31 = (byte)(uVar33 >> 0x15);
              pvVar18 = local_38[0x12];
              goto LAB_0010db2d;
            }
            if (uVar7 == 0x30000000) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_78,
                         (size_type)
                         (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_78.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar31 = (byte)(uVar33 >> 0x15);
              pvVar18 = local_38[0x13];
              goto LAB_0010db2d;
            }
            uVar21 = uVar33 & 0xfc00ffff;
            if (uVar21 == 0x7c0005d4) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_78,
                         (size_type)
                         (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_78.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar31 = (byte)(uVar33 >> 0x15);
              pvVar18 = local_38[0x14];
LAB_0010dc2a:
              *(void **)(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
              bVar31 = bVar31 & 0x1f;
              bVar13 = bVar14;
LAB_0010dc32:
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish[-8] = bVar31;
LAB_0010dc36:
              bVar13 = bVar13 & 0x1f;
LAB_0010dc39:
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish[-7] = bVar13;
              p_Var35 = local_58;
              goto LAB_0010d916;
            }
            if (uVar21 == 0x7c0001d5) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_78,
                         (size_type)
                         (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_78.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar31 = (byte)(uVar33 >> 0x15);
              pvVar18 = local_38[0x15];
              goto LAB_0010dc2a;
            }
            if (uVar21 == 0x7c0005d5) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_78,
                         (size_type)
                         (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_78.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar31 = (byte)(uVar33 >> 0x15);
              pvVar18 = local_38[0x16];
              goto LAB_0010dc2a;
            }
            if (uVar21 == 0x7c0001d4) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_78,
                         (size_type)
                         (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_78.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar31 = (byte)(uVar33 >> 0x15);
              pvVar18 = local_38[0x17];
              goto LAB_0010dc2a;
            }
            if (uVar21 != 0x7c0007d4) {
              if (uVar21 == 0x7c0003d5) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x19];
                goto LAB_0010dd16;
              }
              if (uVar21 == 0x7c0007d5) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x1a];
                goto LAB_0010dd16;
              }
              if (uVar21 == 0x7c0003d4) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x1b];
                goto LAB_0010dd16;
              }
              if (uVar21 == 0x7c000594) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x1c];
                goto LAB_0010dc2a;
              }
              if (uVar21 == 0x7c000195) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x1d];
                goto LAB_0010dc2a;
              }
              if (uVar21 == 0x7c000595) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x1e];
                goto LAB_0010dc2a;
              }
              if (uVar21 == 0x7c000194) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x1f];
                goto LAB_0010dc2a;
              }
              if (uVar17 == 0x7c000039) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0xb);
                bVar13 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x20];
LAB_0010df05:
                *(void **)(local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish[-8] = bVar13 & 0x1f;
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish[-7] = bVar14 & 0x1f;
                bVar31 = bVar31 & 0x1f;
LAB_0010df1a:
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish[-6] = bVar31;
                p_Var35 = local_58;
                goto LAB_0010d916;
              }
              if (uVar17 == 0x7c000038) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0xb);
                bVar13 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x21];
                goto LAB_0010df05;
              }
              if (uVar17 == 0x7c000079) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0xb);
                bVar13 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x22];
                goto LAB_0010df05;
              }
              if (uVar17 == 0x7c000078) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0xb);
                bVar13 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x23];
                goto LAB_0010df05;
              }
              if (uVar7 == 0x74000000) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x24];
                goto LAB_0010db2d;
              }
              if (uVar7 == 0x70000000) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x25];
                goto LAB_0010db2d;
              }
              uVar23 = uVar33 & 0xfc000003;
              if (uVar23 == 0x48000002) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                uVar34 = uVar33 >> 2 & 0xffffff;
                pvVar18 = local_38[0x26];
LAB_0010e15c:
                *(void **)(local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                *(uint *)(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -4) = uVar34;
                goto LAB_0010dd28;
              }
              if (uVar23 == 0x48000001) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                uVar34 = uVar33 >> 2 & 0xffffff;
                pvVar18 = local_38[0x27];
                goto LAB_0010e15c;
              }
              if (uVar23 == 0x48000003) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                uVar34 = uVar33 >> 2 & 0xffffff;
                pvVar18 = local_38[0x28];
                goto LAB_0010e15c;
              }
              if (uVar23 == 0x48000000) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                uVar34 = uVar33 >> 2 & 0xffffff;
                pvVar18 = local_38[0x29];
                goto LAB_0010e15c;
              }
              if (uVar23 == 0x58000002) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                uVar34 = uVar33 >> 2 & 0xffffff;
                pvVar18 = local_38[0x2a];
                goto LAB_0010e15c;
              }
              if (uVar23 == 0x58000001) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                uVar34 = uVar33 >> 2 & 0xffffff;
                pvVar18 = local_38[0x2b];
                goto LAB_0010e15c;
              }
              if (uVar23 == 0x58000003) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                uVar34 = uVar33 >> 2 & 0xffffff;
                pvVar18 = local_38[0x2c];
                goto LAB_0010e15c;
              }
              if (uVar23 == 0x58000000) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                uVar34 = uVar33 >> 2 & 0xffffff;
                pvVar18 = local_38[0x2d];
                goto LAB_0010e15c;
              }
              if (uVar23 == 0x40000002) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x2e];
LAB_0010e246:
                *(void **)(local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish + -0x10) = pvVar18;
LAB_0010e24a:
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish[-2] = bVar31;
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish[-1] = bVar14 & 0x1f;
                uVar16 = (ushort)(uVar2 >> 2);
LAB_0010e25a:
                *(ushort *)
                 (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish + -4) = uVar16;
                goto LAB_0010dd28;
              }
              if (uVar23 == 0x40000001) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x2f];
                goto LAB_0010e246;
              }
              if (uVar23 == 0x40000003) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x30];
                goto LAB_0010e246;
              }
              if (uVar23 == 0x40000000) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x31];
                goto LAB_0010e246;
              }
              if (uVar23 == 0x24000002) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x32];
LAB_0010e340:
                *(void **)(local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                bVar31 = bVar31 & 0x1f;
                goto LAB_0010e24a;
              }
              if (uVar23 == 0x24000001) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x33];
                goto LAB_0010e340;
              }
              if (uVar23 == 0x24000003) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x34];
                goto LAB_0010e340;
              }
              if (uVar23 == 0x24000000) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x35];
                goto LAB_0010e340;
              }
              if (uVar21 == 0x4c000421) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x36];
                goto LAB_0010dd16;
              }
              if (uVar21 == 0x4c000420) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x37];
                goto LAB_0010dd16;
              }
              if (uVar21 == 0x4c000423) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x38];
                goto LAB_0010dd16;
              }
              if (uVar21 == 0x4c000422) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x39];
                goto LAB_0010dd16;
              }
              if (uVar21 == 0x4c000021) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x3a];
                goto LAB_0010dd16;
              }
              if (uVar21 == 0x4c000020) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x3b];
                goto LAB_0010dd16;
              }
              if (uVar21 == 0x4c000023) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x3c];
                goto LAB_0010dd16;
              }
              if (uVar21 == 0x4c000022) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x3d];
                goto LAB_0010dd16;
              }
              uVar23 = uVar33 & 0xfc6007ff;
              if (uVar23 == 0x7c200000) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x17);
                pvVar18 = local_38[0x3e];
LAB_0010f62b:
                bVar13 = (byte)(uVar33 >> 0xb);
                *(void **)(local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish[-6] = bVar31 & 7;
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish[-8] = bVar14 & 0x1f;
                goto LAB_0010dc36;
              }
              if (uVar23 == 0x7c000000) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar31 = (byte)(uVar33 >> 0x17);
                pvVar18 = local_38[0x3f];
                goto LAB_0010f62b;
              }
              uVar27 = uVar33 & 0xfc600000;
              if (uVar27 != 0x2c200000) {
                if (uVar27 == 0x2c000000) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x17);
                  pvVar18 = local_38[0x41];
                  goto LAB_0010e6fb;
                }
                if (uVar23 == 0x7c200040) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x17);
                  pvVar18 = local_38[0x42];
                  goto LAB_0010f62b;
                }
                if (uVar23 == 0x7c000040) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x17);
                  pvVar18 = local_38[0x43];
                  goto LAB_0010f62b;
                }
                if (uVar27 == 0x28200000) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x17);
                  pvVar18 = local_38[0x44];
                  goto LAB_0010e6fb;
                }
                if (uVar27 == 0x28000000) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x17);
                  pvVar18 = local_38[0x45];
                  goto LAB_0010e6fb;
                }
                if (uVar21 == 0x7c000035) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x46];
                  goto LAB_0010dc2a;
                }
                if (uVar21 == 0x7c000034) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x47];
                  goto LAB_0010dc2a;
                }
                if (uVar21 == 0x7c000075) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x48];
                  goto LAB_0010dd16;
                }
                if (uVar21 == 0x7c000074) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x49];
                  goto LAB_0010dd16;
                }
                if (uVar17 == 0x4c000202) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x4a];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x4c000102) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x4b];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x4c000242) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x4c];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x4c0001c2) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x4d];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x4c000042) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x4e];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x4c000382) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x4f];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x4c000342) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x50];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x4c000182) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x51];
                  goto LAB_0010df05;
                }
                local_4c = uVar3 & 0xffe007ff | uVar24;
                if (local_4c == 0x7c0005fc) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar18 = local_38[0x52];
LAB_00110641:
                  bVar13 = (byte)(uVar33 >> 0xb);
                  *(void **)(local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                  bVar31 = bVar14;
                  goto LAB_0010dc32;
                }
                if (local_4c == 0x7c0005ec) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar18 = local_38[0x53];
                  goto LAB_00110641;
                }
                if (local_4c == 0x7c0000bc) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar18 = local_38[0x54];
                  goto LAB_00110641;
                }
                if (local_4c == 0x7c0000ac) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar18 = local_38[0x55];
                  goto LAB_00110641;
                }
                bVar31 = bVar14;
                if (local_4c == 0x7c0003bc) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar18 = local_38[0x56];
LAB_001148f4:
                  bVar14 = (byte)(uVar33 >> 0xb);
                  *(void **)(local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                  goto LAB_0010dd1e;
                }
                if (local_4c == 0x7c0003ac) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar18 = local_38[0x57];
                  goto LAB_001148f4;
                }
                if (local_4c == 0x7c00007c) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar18 = local_38[0x58];
                  goto LAB_00110641;
                }
                if (local_4c == 0x7c00006c) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar18 = local_38[0x59];
                  goto LAB_00110641;
                }
                if (uVar17 == 0x7c00023c) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x5a];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x7c00022c) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x5b];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x7c0001fc) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x5c];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x7c0001ec) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x5d];
                  goto LAB_0010df05;
                }
                if (local_4c == 0x7c0007fc) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar18 = local_38[0x5e];
                  goto LAB_001148f4;
                }
                if (local_4c == 0x7c0007ec) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar18 = local_38[0x5f];
                  goto LAB_001148f4;
                }
                if (uVar17 == 0x7c0007d2) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x60];
LAB_00114a1c:
                  *(void **)(local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish[-4] = bVar13 & 0x1f;
                  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish[-3] = bVar14 & 0x1f;
                  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish[-2] = bVar31 & 0x1f;
                  goto LAB_0010dd28;
                }
                if (uVar17 == 0x7c0003d3) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x61];
                  goto LAB_00114a1c;
                }
                if (uVar17 == 0x7c0007d3) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x62];
                  goto LAB_00114a1c;
                }
                if (uVar17 == 0x7c0003d2) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[99];
                  goto LAB_00114a1c;
                }
                if (uVar17 == 0x7c000792) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[100];
                  goto LAB_00114a1c;
                }
                if (uVar17 == 0x7c000393) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x65];
                  goto LAB_00114a1c;
                }
                if (uVar17 == 0x7c000793) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x66];
                  goto LAB_00114a1c;
                }
                if (uVar17 == 0x7c000392) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x67];
                  goto LAB_00114a1c;
                }
                if (uVar17 == 0x7c0007d6) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x68];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x7c0003d7) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x69];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x7c0007d7) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x6a];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x7c0003d6) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x6b];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x7c000796) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x6c];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x7c000397) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x6d];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x7c000797) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x6e];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x7c000396) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x6f];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x7c000239) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x70];
                  goto LAB_0010df05;
                }
                if (uVar17 == 0x7c000238) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0xb);
                  bVar13 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x71];
                  goto LAB_0010df05;
                }
                if (uVar21 == 0x7c000775) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x72];
                  goto LAB_0010dc2a;
                }
                if (uVar21 == 0x7c000774) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x73];
                  goto LAB_0010dc2a;
                }
                if (uVar21 == 0x7c000735) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x74];
                  goto LAB_0010dc2a;
                }
                if (uVar21 == 0x7c000734) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x75];
                  goto LAB_0010dc2a;
                }
                if (uVar21 == 0x7c0007b5) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x76];
                  goto LAB_0010dd16;
                }
                if (uVar21 == 0x7c0007b4) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar31 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0x77];
                  goto LAB_0010dd16;
                }
                local_44 = uVar2 & 0x7fe;
                bVar13 = (byte)(uVar34 >> 0x18);
                bVar36 = 0xfbffffff < uVar33;
                bVar26 = (uVar4 & 0x1f0000) == 0;
                local_4f = bVar26 && bVar36;
                if ((local_44 != 0x210 || (!bVar26 || !bVar36)) || (uVar25 & 1) == 0) {
                  if (((~(local_44 == 0x210 && (bool)local_4f) | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x79];
                    goto LAB_00111732;
                  }
                  bVar37 = 0xdfffffff < uVar33;
                  bVar41 = (~uVar33 & 0x1c000000) == 0;
                  local_4d = bVar41 && bVar37;
                  bVar40 = (uVar2 & 0x7c0) == 0;
                  local_45 = bVar40 && (bool)local_4d;
                  uVar23 = uVar25 & 0x3e;
                  if (((uVar25 & 1) == 0) && (uVar23 == 0x2a && (bVar40 && (bVar41 && bVar37)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 0xb);
                    bVar13 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x7a];
                    goto LAB_0010df05;
                  }
                  bVar8 = (uVar2 & 0x7c0) == 0;
                  bVar38 = 0xdfffffff < uVar33;
                  bVar42 = (uVar24 & 0x1c000000) == 0xc000000;
                  local_4e = bVar42 && bVar38;
                  local_46 = bVar8 && (bool)local_4e;
                  if (((uVar25 & 1) != 0) && (uVar23 == 0x2a && (bVar8 && (bVar42 && bVar38)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 0xb);
                    bVar13 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x7b];
                    goto LAB_0010df05;
                  }
                  if (((uVar25 & 1) != 0) && (uVar23 == 0x2a && (bVar40 && (bVar41 && bVar37)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 0xb);
                    bVar13 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x7c];
                    goto LAB_0010df05;
                  }
                  if (((~(uVar23 == 0x2a && (bool)local_46) | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 0xb);
                    bVar13 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x7d];
                    goto LAB_0010df05;
                  }
                  if ((bVar26 && bVar36) && (uVar25 | uVar28 & 0x7ff) == 0x69c) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar14 = (byte)(uVar33 >> 0xb);
                    bVar31 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x7e];
                    goto LAB_001104db;
                  }
                  bVar39 = 0xfbffffff < uVar33;
                  bVar9 = (uVar4 & 0x600000) == 0;
                  local_3d = bVar9 && bVar39;
                  bVar5 = (uVar2 & 0x780) == 0;
                  if ((uVar25 & 0x7f) == 0x40 && (bVar5 && (bVar9 && bVar39))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 0x17);
                    pvVar18 = local_38[0x7f];
                    goto LAB_0010f62b;
                  }
                  if ((uVar25 & 0x7f) == 0 && (bVar5 && (bVar9 && bVar39))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 0x17);
                    pvVar18 = local_38[0x80];
                    goto LAB_0010f62b;
                  }
                  uVar28 = uVar2 & 0x7fc;
                  if ((((uVar25 & 1) == 0) && (uVar28 == 0x65c && (bVar26 && bVar36))) &&
                     ((uVar25 & 2) != 0)) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x81];
                    goto LAB_00111732;
                  }
                  if ((uVar28 == 0x65c && (bVar26 && bVar36)) && (uVar25 & 3) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x82];
                    goto LAB_00111732;
                  }
                  bVar5 = (uVar25 & 2) != 0;
                  bVar43 = uVar28 == 0x1c;
                  if (((uVar25 & 1) == 0) && ((bVar43 && (bVar26 && bVar36)) && bVar5)) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x83];
                    goto LAB_00111732;
                  }
                  bVar6 = (uVar25 & 2) == 0;
                  if (((uVar25 & 1) != 0) && (bVar6 && (bVar43 && (bVar26 && bVar36)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x84];
                    goto LAB_00111732;
                  }
                  if ((uVar25 & 1) != 0 && ((bVar43 && (bVar26 && bVar36)) && bVar5)) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x85];
                    goto LAB_00111732;
                  }
                  if (((~(bVar6 && (bVar43 && (bool)local_4f)) | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x86];
                    goto LAB_00111732;
                  }
                  if (((uVar25 & 1) == 0) && (uVar23 == 0x24 && (bVar40 && (bVar41 && bVar37)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 0xb);
                    bVar13 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x87];
                    goto LAB_0010df05;
                  }
                  if (((uVar25 & 1) != 0) && (uVar23 == 0x24 && (bVar8 && (bVar42 && bVar38)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 0xb);
                    bVar13 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x88];
                    goto LAB_0010df05;
                  }
                  if (((uVar25 & 1) != 0) && (uVar23 == 0x24 && (bVar40 && (bVar41 && bVar37)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 0xb);
                    bVar13 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x89];
                    goto LAB_0010df05;
                  }
                  if (((~(uVar23 == 0x24 && (bool)local_46) | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 0xb);
                    bVar13 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x8a];
                    goto LAB_0010df05;
                  }
                  bVar26 = uVar23 == 0x3a && (bool)local_4d;
                  if (((~bVar26 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x8b];
LAB_00110153:
                    *(void **)(local_78.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-8] = bVar19 & 0x1f;
                    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-7] = bVar14 & 0x1f;
                    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-6] = bVar13 & 0x1f;
                    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-5] = bVar31 & 0x1f;
                    p_Var35 = local_58;
                    goto LAB_0010d916;
                  }
                  bVar36 = uVar23 == 0x3a && (bool)local_4e;
                  if (bVar36 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x8c];
                    goto LAB_00110153;
                  }
                  if (bVar26 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x8d];
                    goto LAB_00110153;
                  }
                  if (((~bVar36 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x8e];
                    goto LAB_00110153;
                  }
                  bVar26 = local_44 == 0x90 && (bool)local_4f;
                  if (bVar26 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x8f];
                    goto LAB_00111732;
                  }
                  if (((~bVar26 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x90];
                    goto LAB_00111732;
                  }
                  bVar26 = uVar23 == 0x38 && (bool)local_4d;
                  if (((~bVar26 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x91];
                    goto LAB_00110153;
                  }
                  bVar36 = uVar23 == 0x38 && (bool)local_4e;
                  if (bVar36 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x92];
                    goto LAB_00110153;
                  }
                  if (bVar26 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x93];
                    goto LAB_00110153;
                  }
                  if (((~bVar36 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x94];
                    goto LAB_00110153;
                  }
                  bVar26 = (uVar2 & 0xf83e) == 0x32 && (bool)local_4d;
                  if (((~bVar26 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x95];
LAB_0010fd84:
                    *(void **)(local_78.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-8] = bVar13 & 0x1f;
                    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-7] = bVar14 & 0x1f;
                    goto LAB_0010df1a;
                  }
                  bVar36 = (uVar2 & 0xf83e) == 0x32 && (bool)local_4e;
                  if (bVar36 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x96];
                    goto LAB_0010fd84;
                  }
                  if (bVar26 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x97];
                    goto LAB_0010fd84;
                  }
                  if (((~bVar36 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x98];
                    goto LAB_0010fd84;
                  }
                  bVar26 = local_44 == 0x110 && (bool)local_4f;
                  if (bVar26 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x99];
                    goto LAB_00111732;
                  }
                  if (((~bVar26 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x9a];
                    goto LAB_00111732;
                  }
                  bVar26 = local_44 == 0x50 && (bool)local_4f;
                  if (bVar26 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x9b];
                    goto LAB_00111732;
                  }
                  if (((~bVar26 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar14 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x9c];
                    goto LAB_00111732;
                  }
                  bVar26 = uVar23 == 0x3e && (bool)local_4d;
                  if (((~bVar26 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x9d];
                    goto LAB_00110153;
                  }
                  bVar36 = uVar23 == 0x3e && (bool)local_4e;
                  if (bVar36 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x9e];
                    goto LAB_00110153;
                  }
                  if (bVar26 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0x9f];
                    goto LAB_00110153;
                  }
                  if (((~bVar36 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0xa0];
                    goto LAB_00110153;
                  }
                  bVar26 = uVar23 == 0x3c && (bool)local_4d;
                  if (((~bVar26 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0xa1];
                    goto LAB_00110153;
                  }
                  bVar36 = uVar23 == 0x3c && (bool)local_4e;
                  if (bVar36 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0xa2];
                    goto LAB_00110153;
                  }
                  if (bVar26 && (uVar25 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0xa3];
                    goto LAB_00110153;
                  }
                  if (((~bVar36 | bVar13) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 6);
                    bVar13 = (byte)(uVar33 >> 0xb);
                    bVar19 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0xa4];
                    goto LAB_00110153;
                  }
                  uVar28 = uVar33 & 0xfc1f07ff;
                  if (uVar28 != 0xec000031) {
                    if (uVar28 == 0xec000030) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar14 = (byte)(uVar33 >> 0xb);
                      bVar31 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xa6];
                      goto LAB_001104db;
                    }
                    bVar26 = local_44 == 0x18 && (bool)local_4f;
                    if (bVar26 && (uVar25 & 1) != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar33 >> 0xb);
                      bVar14 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xa7];
                      goto LAB_00111732;
                    }
                    if (((~bVar26 | bVar13) & 1) == 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar33 >> 0xb);
                      bVar14 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xa8];
                      goto LAB_00111732;
                    }
                    bVar26 = local_44 == 0x34 && (bool)local_4f;
                    if (bVar26 && (uVar25 & 1) != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar14 = (byte)(uVar33 >> 0xb);
                      bVar31 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xa9];
                      goto LAB_001104db;
                    }
                    if (((~bVar26 | bVar13) & 1) == 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar14 = (byte)(uVar33 >> 0xb);
                      bVar31 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xaa];
                      goto LAB_001104db;
                    }
                    if ((uVar23 == 0x2e && 0xfbffffff < uVar33) && (uVar25 & 1) != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar31 = (byte)(uVar33 >> 6);
                      bVar13 = (byte)(uVar33 >> 0xb);
                      bVar19 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xab];
LAB_00112d8f:
                      *(void **)(local_78.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-4] = bVar19 & 0x1f;
                      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-3] = bVar14 & 0x1f;
                      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-2] = bVar13 & 0x1f;
                      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1] = bVar31 & 0x1f;
                      goto LAB_0010dd28;
                    }
                    if (((~(uVar23 == 0x2e && 0xfbffffff < uVar33) | bVar13) & 1) == 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar31 = (byte)(uVar33 >> 6);
                      bVar13 = (byte)(uVar33 >> 0xb);
                      bVar19 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xac];
                      goto LAB_00112d8f;
                    }
                    bVar26 = (uVar3 & 0x1f07fe) == 0x2c && (bool)local_4d;
                    if (((~bVar26 | bVar13) & 1) == 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar14 = (byte)(uVar33 >> 0xb);
                      bVar31 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xad];
                      goto LAB_001104db;
                    }
                    bVar36 = (uVar3 & 0x1f07fe) == 0x2c && (bool)local_4e;
                    if (bVar36 && (uVar25 & 1) != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar14 = (byte)(uVar33 >> 0xb);
                      bVar31 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xae];
                      goto LAB_001104db;
                    }
                    if (bVar26 && (uVar25 & 1) != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar14 = (byte)(uVar33 >> 0xb);
                      bVar31 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xaf];
                      goto LAB_001104db;
                    }
                    if (((~bVar36 | bVar13) & 1) == 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar14 = (byte)(uVar33 >> 0xb);
                      bVar31 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xb0];
                      goto LAB_001104db;
                    }
                    if (((uVar25 & 1) == 0) && (uVar23 == 0x28 && (bVar40 && (bVar41 && bVar37)))) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar31 = (byte)(uVar33 >> 0xb);
                      bVar13 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xb1];
                      goto LAB_0010df05;
                    }
                    if (((uVar25 & 1) != 0) && (uVar23 == 0x28 && (bVar8 && (bVar42 && bVar38)))) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar31 = (byte)(uVar33 >> 0xb);
                      bVar13 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xb2];
                      goto LAB_0010df05;
                    }
                    if (((uVar25 & 1) != 0) && (uVar23 == 0x28 && (bVar40 && (bVar41 && bVar37)))) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar31 = (byte)(uVar33 >> 0xb);
                      bVar13 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xb3];
                      goto LAB_0010df05;
                    }
                    if (((~(uVar23 == 0x28 && (bool)local_46) | bVar13) & 1) == 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar31 = (byte)(uVar33 >> 0xb);
                      bVar13 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xb4];
                      goto LAB_0010df05;
                    }
                    if (local_4c == 0x7c0007ac) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar18 = local_38[0xb5];
                      goto LAB_00110641;
                    }
                    if (uVar17 == 0x7c00002c) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar31 = (byte)(uVar33 >> 0xb);
                      bVar13 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xb6];
                      goto LAB_0010df05;
                    }
                    if (uVar34 == 0x2c01004c) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (8 - (long)local_78.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar18 = local_38[0xb7];
                      goto LAB_00114cf7;
                    }
                    uVar24 = uVar33 & 0xfc1f0000;
                    if (uVar24 == 0x8c000000) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar14 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xb8];
                      goto LAB_001117b0;
                    }
                    if (uVar7 == 0x88000000) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar31 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xb9];
LAB_00114cb7:
                      *(void **)(local_78.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                      bVar31 = bVar31 & 0x1f;
LAB_00114cbe:
                      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-6] = bVar31;
                      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-5] = bVar14 & 0x1f;
LAB_00114cc7:
                      *(undefined2 *)
                       (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish + -8) = uVar32;
                      p_Var35 = local_58;
                      goto LAB_0010d916;
                    }
                    if (uVar7 == 0x8c000000) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar31 = (byte)(uVar33 >> 0x15);
                      pvVar18 = local_38[0xba];
                      goto LAB_00114cb7;
                    }
                    uVar23 = uVar33 & 0xfc00000f;
                    if (uVar23 != 0xe8000001) {
                      if (uVar23 == 0xe8000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xbd];
                        goto LAB_00113e24;
                      }
                      if (uVar17 == 0x7c0000ae) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xbe];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c0000ee) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xbf];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c0000ee) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xc0];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c0000ae) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xc1];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c0000fe) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xc2];
                        goto LAB_00114a1c;
                      }
                      if (uVar17 == 0x7c0000be) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xc3];
                        goto LAB_00114a1c;
                      }
                      if (uVar17 == 0x7c0003be) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xc4];
                        goto LAB_00114a1c;
                      }
                      if (uVar23 == 0xf8000001) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xc5];
                        goto LAB_00113e24;
                      }
                      if (uVar23 == 0xf8000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xc6];
                        goto LAB_00113e24;
                      }
                      if (uVar17 == 0x7c00067e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[199];
                        goto LAB_00114a1c;
                      }
                      if (uVar17 == 0x7c00063e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[200];
                        goto LAB_00114a1c;
                      }
                      if (uVar24 == 0xcc000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xc9];
LAB_001117b0:
                        *(void **)(local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-6] = bVar14 & 0x1f;
                        goto LAB_00114cc7;
                      }
                      if (uVar7 == 0xc8000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xca];
                        goto LAB_00114cb7;
                      }
                      if (uVar7 == 0xcc000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xcb];
                        goto LAB_00114cb7;
                      }
                      if (uVar23 == 0xf8000007) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xcd];
                        goto LAB_00113e24;
                      }
                      if (uVar23 == 0xf8000006) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xce];
                        goto LAB_00113e24;
                      }
                      if (uVar17 == 0x7c0004ae) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xcf];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c0004ee) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xd0];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c0004ee) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xd1];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c0004ae) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xd2];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c0004fe) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xd3];
                        goto LAB_00114a1c;
                      }
                      if (uVar17 == 0x7c0004be) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xd4];
                        goto LAB_00114a1c;
                      }
                      if (uVar24 == 0xc4000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xd5];
                        goto LAB_001117b0;
                      }
                      if (uVar7 == 0xc0000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xd6];
LAB_00114445:
                        *(void **)(local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                        goto LAB_00114cbe;
                      }
                      if (uVar7 == 0xc4000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xd7];
                        goto LAB_00114cb7;
                      }
                      if (uVar23 == 0xf8000005) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xd9];
                        goto LAB_00113e24;
                      }
                      if (uVar23 == 0xf8000004) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xda];
                        goto LAB_00113e24;
                      }
                      if (uVar17 == 0x7c00042e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xdb];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c00046e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xdc];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c00046e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xdd];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c00042e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xde];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c00047e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xdf];
                        goto LAB_00114a1c;
                      }
                      if (uVar17 == 0x7c00043e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xe0];
                        goto LAB_00114a1c;
                      }
                      if (uVar24 == 0xac000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xe1];
                        goto LAB_001117b0;
                      }
                      if (uVar7 == 0xa8000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xe2];
                        goto LAB_00114cb7;
                      }
                      if (uVar7 == 0xac000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xe3];
                        goto LAB_00114cb7;
                      }
                      if (uVar23 == 0xe8000005) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xe5];
                        goto LAB_00113e24;
                      }
                      if (uVar23 == 0xe8000004) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xe6];
                        goto LAB_00113e24;
                      }
                      if (uVar17 == 0x7c0002ae) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xe7];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c0002ee) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xe8];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c0002ee) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xe9];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c0002ae) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xea];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c0002fe) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xeb];
                        goto LAB_00114a1c;
                      }
                      if (uVar17 == 0x7c0002be) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xec];
                        goto LAB_00114a1c;
                      }
                      if (uVar17 == 0x7c00062c) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xed];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c00062c) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xee];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c00063c) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xef];
                        goto LAB_00114a1c;
                      }
                      if (uVar24 == 0xa4000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xf0];
                        goto LAB_001117b0;
                      }
                      if (uVar7 == 0xa0000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xf1];
                        goto LAB_00114445;
                      }
                      if (uVar7 == 0xa4000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xf2];
                        goto LAB_00114cb7;
                      }
                      if (uVar23 == 0xe8000003) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xf4];
                        goto LAB_00113e24;
                      }
                      if (uVar23 == 0xe8000002) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xf5];
                        goto LAB_00113e24;
                      }
                      if (uVar17 == 0x7c00022e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xf6];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c00026e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xf7];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c00026e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xf8];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c00022e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xf9];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c00027e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xfa];
                        goto LAB_00114a1c;
                      }
                      if (uVar17 == 0x7c00023e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xfb];
                        goto LAB_00114a1c;
                      }
                      if (uVar7 == 0xb8000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xfc];
                        goto LAB_00114cb7;
                      }
                      if (uVar17 == 0x7c0004aa) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xfe];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c0004aa) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0xff];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c00042a) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x100];
                        goto LAB_00114a1c;
                      }
                      if (uVar17 == 0x7c000028) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x101];
                        goto LAB_0010df05;
                      }
                      if (uVar17 == 0x7c0000fc) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x102];
                        goto LAB_00114a1c;
                      }
                      if (uVar17 == 0x7c00042c) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x103];
                        goto LAB_0010df05;
                      }
                      if (uVar28 == 0x7c00042c) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar33 >> 0xb);
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x104];
                        goto LAB_00111732;
                      }
                      if (uVar17 == 0x7c00043c) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x105];
                        goto LAB_00114a1c;
                      }
                      if (uVar24 == 0x84000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x106];
                        goto LAB_001117b0;
                      }
                      if (uVar7 == 0x84000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x108];
                        goto LAB_00114cb7;
                      }
                      if (uVar23 == 0xe8000007) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x10a];
                        goto LAB_00113e24;
                      }
                      if (uVar23 == 0xe8000006) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x10b];
                        goto LAB_00113e24;
                      }
                      if (uVar17 == 0x7c00006e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x10c];
                        goto LAB_0010df05;
                      }
                      if (uVar17 == 0x7c00002e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x10d];
                        goto LAB_0010df05;
                      }
                      if (uVar17 == 0x7c00007e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x10e];
                        goto LAB_00114a1c;
                      }
                      if (uVar17 == 0x7c00003e) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar31 = (byte)(uVar33 >> 0xb);
                        bVar13 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x10f];
                        goto LAB_00114a1c;
                      }
                      uVar28 = uVar33 & 0xfc1fffff;
                      if (uVar28 == 0x7c0006ac) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar14 = (byte)(uVar33 >> 0x15);
                        pvVar18 = local_38[0x110];
                        goto LAB_001120a7;
                      }
                      if ((uVar33 & 0xfc63ffff) != 0x4c000000) {
                        if ((bVar9 && bVar39) && (uVar2 | uVar4 & 0x3ffff) == 0x80) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          *(void **)(local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) =
                               local_38[0x112];
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-4] =
                               (byte)(uVar33 >> 0x17) & 7;
                          bVar14 = (byte)(uVar33 >> 0x12) & 7;
                          goto LAB_0010dd25;
                        }
                        if ((uVar33 & 0xfc7fffff) == 0x7c000400) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x17);
                          pvVar18 = local_38[0x113];
LAB_00111af1:
                          *(void **)(local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                          bVar14 = bVar14 & 7;
LAB_00114b6b:
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-4] = bVar14;
                          goto LAB_0010dd28;
                        }
                        if ((uVar33 & 0xfc7fffff) == 0x7c000440) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x17);
                          pvVar18 = local_38[0x114];
                          goto LAB_00111af1;
                        }
                        if (uVar21 == 0x7c000226) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x115];
                          goto LAB_0010dd16;
                        }
                        if (uVar28 == 0x7c000026) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x116];
                          goto LAB_001120a7;
                        }
                        if (uVar17 == 0x7c000286) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          uVar16 = (ushort)(uVar33 >> 0xb);
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x117];
                          goto LAB_001120eb;
                        }
                        bVar36 = (uVar3 & 0x1ff800) == 0;
                        bVar40 = 0xfbffffff < uVar33;
                        bVar26 = bVar40 && bVar36;
                        if ((local_44 == 0x48e && (bVar40 && bVar36)) && (uVar25 & 1) != 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x118];
LAB_001120a7:
                          *(void **)(local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-8] = bVar14 & 0x1f;
                          p_Var35 = local_58;
                          goto LAB_0010d916;
                        }
                        if (((~(local_44 == 0x48e && bVar26) | bVar13) & 1) == 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x119];
                          goto LAB_001120a7;
                        }
                        if (uVar28 == 0x7c0000a6) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x11a];
                          goto LAB_00114b63;
                        }
                        if (uVar28 == 0x7c0802a6) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x11b];
                          goto LAB_001120a7;
                        }
                        if (uVar28 == 0x7c0902a6) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x11c];
                          goto LAB_001120a7;
                        }
                        if (uVar17 == 0x7c0002a6) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          uVar16 = (ushort)(uVar33 >> 0xb);
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x11d];
LAB_001120eb:
                          *(void **)(local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-2] = bVar14 & 0x1f;
                          uVar16 = uVar16 & 0x3ff;
                          goto LAB_0010e25a;
                        }
                        if (uVar34 == 0xac04007c) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (8 - (long)local_78.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start)));
                          pvVar18 = local_38[0x11e];
                          goto LAB_00114cf7;
                        }
                        if ((uVar33 & 0xfc100fff) == 0x7c000120) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          *(void **)(local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) =
                               local_38[0x11f];
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-7] =
                               (byte)(uVar33 >> 0x15) & 0x1f;
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-8] = (uchar)(uVar33 >> 0xc);
                          p_Var35 = local_58;
                          goto LAB_0010d916;
                        }
                        if (uVar17 == 0x7c000386) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          uVar16 = (ushort)(uVar33 >> 0xb);
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x120];
                          goto LAB_001120eb;
                        }
                        if ((local_44 == 0x8c && (bVar40 && bVar36)) && (uVar25 & 1) != 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x121];
LAB_00114b63:
                          *(void **)(local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                          bVar14 = bVar14 & 0x1f;
                          goto LAB_00114b6b;
                        }
                        if (((~(local_44 == 0x8c && bVar26) | bVar13) & 1) == 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x122];
                          goto LAB_00114b63;
                        }
                        if ((local_44 == 0x4c && (bVar40 && bVar36)) && (uVar25 & 1) != 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x123];
                          goto LAB_00114b63;
                        }
                        if (((~(local_44 == 0x4c && bVar26) | bVar13) & 1) == 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x124];
                          goto LAB_00114b63;
                        }
                        bVar26 = (uVar33 & 0x20107fe) == 0x58e;
                        if ((bVar26 && 0xfbffffff < uVar33) && (uVar25 & 1) != 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x11);
                          pvVar18 = local_38[0x125];
                          goto LAB_001148f4;
                        }
                        if (((~(bVar26 && 0xfbffffff < uVar33) | bVar13) & 1) == 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          pvVar18 = local_38[0x126];
                          bVar31 = (byte)(uVar33 >> 0x11);
                          goto LAB_001148f4;
                        }
                        bVar26 = (uVar3 & 0x7f0ffe) == 0x10c;
                        if ((bVar26 && 0xfbffffff < uVar33) && (uVar25 & 1) != 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          uVar15 = (uchar)(uVar33 >> 0xc);
                          bVar14 = (byte)(uVar33 >> 0x17);
                          pvVar18 = local_38[0x127];
LAB_00112002:
                          *(void **)(local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-3] = bVar14 & 7;
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-4] = uVar15;
                          goto LAB_0010dd28;
                        }
                        if (((~(bVar26 && 0xfbffffff < uVar33) | bVar13) & 1) == 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          uVar15 = (uchar)(uVar33 >> 0xc);
                          bVar14 = (byte)(uVar33 >> 0x17);
                          pvVar18 = local_38[0x128];
                          goto LAB_00112002;
                        }
                        if (uVar28 == 0x7c000124) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x129];
                          goto LAB_00114b63;
                        }
                        if (uVar28 == 0x7c0803a6) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x12a];
                          goto LAB_001120a7;
                        }
                        if (uVar28 == 0x7c0903a6) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[299];
                          goto LAB_001120a7;
                        }
                        if (uVar17 == 0x7c0003a6) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          uVar16 = (ushort)(uVar33 >> 0xb);
                          bVar14 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[300];
                          goto LAB_001120eb;
                        }
                        if (uVar17 == 0x7c000093) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x12d];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000092) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x12e];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000013) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x12f];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000012) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x130];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000097) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x131];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000096) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x132];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000017) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x133];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000016) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x134];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c0005d2) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x135];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c0001d2) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x136];
                          goto LAB_00114a1c;
                        }
                        if (uVar7 == 0x1c000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x137];
                          goto LAB_00114cb7;
                        }
                        if (uVar17 == 0x7c0005d6) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x138];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c0001d7) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x139];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c0005d7) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x13a];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c0001d6) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x13b];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c0003b9) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x13c];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c0003b8) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x13d];
                          goto LAB_0010df05;
                        }
                        if (uVar21 == 0x7c0004d0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x13e];
                          goto LAB_0010dc2a;
                        }
                        if (uVar21 == 0x7c0000d1) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x13f];
                          goto LAB_0010dc2a;
                        }
                        if (uVar21 == 0x7c0004d1) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x140];
                          goto LAB_0010dc2a;
                        }
                        if (uVar21 == 0x7c0000d0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x141];
                          goto LAB_0010dc2a;
                        }
                        if (uVar17 == 0x7c0000f9) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x142];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c0000f8) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x143];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000379) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x144];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000378) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x145];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000339) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x146];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000338) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x147];
                          goto LAB_0010df05;
                        }
                        if (uVar7 == 0x64000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x148];
                          goto LAB_00114cb7;
                        }
                        if (uVar7 == 0x60000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x149];
                          goto LAB_00114445;
                        }
                        if (uVar34 == 0x6400004c) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          pvVar18 = local_38[0x14b];
LAB_00114bc6:
                          *(void **)(local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                          goto LAB_0010dd28;
                        }
                        if (uVar34 == 0x6600004c) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          pvVar18 = local_38[0x14a];
                          goto LAB_00114bc6;
                        }
                        uVar25 = uVar33 & 0xfc00003f;
                        if (uVar25 == 0x78000030) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x14c];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000010) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x14d];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000020) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x14e];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000002) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x14f];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000022) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x150];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x151];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000032) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x152];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000012) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x153];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000024) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x154];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000006) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x155];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000026) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x156];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000004) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x157];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000028) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x158];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x7800000a) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x159];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x7800002a) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x15a];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x78000008) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x15b];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x7800002c) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x15c];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x7800000e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x15d];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x7800002e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x15e];
                          goto LAB_00112d8f;
                        }
                        if (uVar25 == 0x7800000c) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar13 = (byte)(uVar33 >> 0xb);
                          bVar19 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x15f];
                          goto LAB_00112d8f;
                        }
                        uVar25 = uVar33 & 0xfc000001;
                        if (uVar25 == 0x50000001) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar19 = (byte)(uVar33 >> 0xb);
                          bVar22 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x160];
LAB_00112f59:
                          *(void **)(local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-8] = bVar22 & 0x1f;
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-7] = bVar14 & 0x1f;
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-6] = bVar19 & 0x1f;
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-5] = bVar31 & 0x1f;
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-4] = bVar13 >> 1 & 0x1f;
                          p_Var35 = local_58;
                          goto LAB_0010d916;
                        }
                        if (uVar25 == 0x50000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar19 = (byte)(uVar33 >> 0xb);
                          bVar22 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x161];
                          goto LAB_00112f59;
                        }
                        if (uVar25 == 0x5c000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar19 = (byte)(uVar33 >> 0xb);
                          bVar22 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x162];
                          goto LAB_00112f59;
                        }
                        if (uVar25 == 0x54000001) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar19 = (byte)(uVar33 >> 0xb);
                          bVar22 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x163];
                          goto LAB_00112f59;
                        }
                        if (uVar25 == 0x5c000001) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar19 = (byte)(uVar33 >> 0xb);
                          bVar22 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x164];
                          goto LAB_00112f59;
                        }
                        if (uVar25 == 0x54000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 6);
                          bVar19 = (byte)(uVar33 >> 0xb);
                          bVar22 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x165];
                          goto LAB_00112f59;
                        }
                        if (uVar34 == 0x2000044) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          pvVar18 = local_38[0x166];
                          goto LAB_00114bc6;
                        }
                        if (uVar17 == 0x7c000036) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x167];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000031) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x168];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000030) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x169];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000634) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x16a];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000676) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x16b];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000674) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x16c];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000670) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x16d];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000631) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x16e];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000671) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x16f];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000630) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x170];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000436) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x171];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000431) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x172];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000430) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x173];
                          goto LAB_0010df05;
                        }
                        if (uVar7 == 0x9c000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x174];
                          goto LAB_00114cb7;
                        }
                        if (uVar7 == 0x98000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x175];
                          goto LAB_00114cb7;
                        }
                        if (uVar23 == 0xe8000009) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x176];
                          goto LAB_00113e24;
                        }
                        if (uVar23 == 0xe8000008) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x177];
                          goto LAB_00113e24;
                        }
                        if (uVar17 == 0x7c0001ee) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x178];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c0001ae) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x179];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c0001fe) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x17a];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c0001be) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x17b];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c0003ff) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x17c];
                          goto LAB_00114a1c;
                        }
                        if (uVar23 == 0xf8000009) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x17d];
                          goto LAB_00113e24;
                        }
                        if (uVar23 == 0xf8000008) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x17e];
                          goto LAB_00113e24;
                        }
                        if (uVar17 == 0x7c00077e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x17f];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c00073e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x180];
                          goto LAB_00114a1c;
                        }
                        if (uVar7 == 0xdc000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x181];
                          goto LAB_00114cb7;
                        }
                        if (uVar7 == 0xd8000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x182];
                          goto LAB_00114cb7;
                        }
                        if (uVar23 == 0xf800000f) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x183];
                          goto LAB_00113e24;
                        }
                        if (uVar23 == 0xf800000e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x184];
                          goto LAB_00113e24;
                        }
                        if (uVar17 == 0x7c0005ee) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x185];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c0005ae) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x186];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c0005fe) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x187];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c0005be) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x188];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c0007ae) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x189];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c0007be) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x18a];
                          goto LAB_00114a1c;
                        }
                        if (uVar7 == 0xd4000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x18b];
                          goto LAB_00114cb7;
                        }
                        if (uVar7 == 0xd0000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x18c];
                          goto LAB_00114cb7;
                        }
                        if (uVar23 == 0xf800000d) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x18d];
                          goto LAB_00113e24;
                        }
                        if (uVar23 == 0xf800000c) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x18e];
                          goto LAB_00113e24;
                        }
                        if (uVar17 == 0x7c00056e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[399];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c00052e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[400];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c00057e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x191];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c00053e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x192];
                          goto LAB_00114a1c;
                        }
                        if (uVar7 == 0xb4000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x193];
                          goto LAB_00114cb7;
                        }
                        if (uVar7 == 0xb0000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x194];
                          goto LAB_00114cb7;
                        }
                        if (uVar23 == 0xe800000b) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x195];
                          goto LAB_00113e24;
                        }
                        if (uVar23 == 0xe800000a) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x196];
                          goto LAB_00113e24;
                        }
                        if (uVar17 == 0x7c00036e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x197];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c00032e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x198];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c00037e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x199];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c00033e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x19a];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c00072c) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x19b];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c00073c) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x19c];
                          goto LAB_00114a1c;
                        }
                        if (uVar7 == 0xbc000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x19d];
                          goto LAB_00114cb7;
                        }
                        if (uVar17 == 0x7c0005aa) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x19e];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c00052a) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x19f];
                          goto LAB_00114a1c;
                        }
                        if (uVar7 == 0x94000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1a0];
                          goto LAB_00114cb7;
                        }
                        if (uVar7 == 0x90000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1a1];
                          goto LAB_00114cb7;
                        }
                        if (uVar23 == 0xe800000f) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1a2];
                          goto LAB_00113e24;
                        }
                        if (uVar23 == 0xe800000e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1a3];
                          goto LAB_00113e24;
                        }
                        if (uVar17 == 0x7c00016e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1a4];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c00012e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1a5];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c00017e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1a6];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c00013e) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1a7];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c00052c) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1a8];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c00053c) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1a9];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c00012d) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1aa];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c00013d) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1ab];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000450) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1ac];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000051) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1ad];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000451) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1ae];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000050) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1af];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000410) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1b0];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000011) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1b1];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000411) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1b2];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000010) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1b3];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000510) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1b4];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000111) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1b5];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000511) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1b6];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000110) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1b7];
                          goto LAB_0010df05;
                        }
                        if (uVar17 == 0x7c000710) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1b8];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000311) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1b9];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000711) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1ba];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000310) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1bb];
                          goto LAB_00114a1c;
                        }
                        if (uVar7 == 0x20000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1bc];
                          goto LAB_00114445;
                        }
                        if (uVar21 == 0x7c0005d0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1bd];
                          goto LAB_0010dc2a;
                        }
                        if (uVar21 == 0x7c0001d1) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1be];
                          goto LAB_0010dc2a;
                        }
                        if (uVar21 == 0x7c0005d1) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1bf];
                          goto LAB_0010dc2a;
                        }
                        if (uVar21 == 0x7c0001d0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1c0];
                          goto LAB_0010dc2a;
                        }
                        if (uVar21 == 0x7c0007d0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1c1];
                          goto LAB_0010dd16;
                        }
                        if (uVar21 == 0x7c0003d1) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1c2];
                          goto LAB_0010dd16;
                        }
                        if (uVar21 == 0x7c0007d1) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1c3];
                          goto LAB_0010dd16;
                        }
                        if (uVar21 == 0x7c0003d0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1c4];
                          goto LAB_0010dd16;
                        }
                        if (uVar21 == 0x7c000590) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1c5];
                          goto LAB_0010dc2a;
                        }
                        if (uVar21 == 0x7c000191) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1c6];
                          goto LAB_0010dc2a;
                        }
                        if (uVar21 == 0x7c000591) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1c7];
                          goto LAB_0010dc2a;
                        }
                        if (uVar21 == 0x7c000190) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1c8];
                          goto LAB_0010dc2a;
                        }
                        if (uVar21 == 0x7c000794) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1c9];
                          goto LAB_0010dd16;
                        }
                        if (uVar21 == 0x7c000395) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1ca];
                          goto LAB_0010dd16;
                        }
                        if (uVar21 == 0x7c000795) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1cb];
                          goto LAB_0010dd16;
                        }
                        if (uVar21 == 0x7c000394) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1cc];
                          goto LAB_0010dd16;
                        }
                        if (uVar34 == 0xac04207c) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (8 - (long)local_78.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start)));
                          pvVar18 = local_38[0x1cd];
LAB_00114cf7:
                          *(void **)(local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -8) = pvVar18;
                          p_Var35 = local_58;
                          goto LAB_0010d916;
                        }
                        if (uVar17 == 0x7c000088) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1ce];
                          goto LAB_00114a1c;
                        }
                        if (uVar7 == 0x8000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          *(void **)(local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) =
                               local_38[0x1cf];
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-2] =
                               (byte)(uVar33 >> 0x15) & 0x1f;
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1] = bVar14 & 0x1f;
                          *(undefined2 *)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish + -4) = uVar32;
                          goto LAB_0010dd28;
                        }
                        if (local_4c == 0x7c000626) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          pvVar18 = local_38[0x1d0];
                          goto LAB_001148f4;
                        }
                        if (local_4c == 0x7c000624) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          pvVar18 = local_38[0x1d1];
                          goto LAB_001148f4;
                        }
                        if (uVar17 == 0x7c000764) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          uVar16 = (ushort)(uVar33 >> 0xb);
                          pvVar18 = local_38[0x1d2];
LAB_00114a93:
                          *(void **)(local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                          *(ushort *)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish + -4) = uVar16 & 0x7fff;
                          goto LAB_0010dd28;
                        }
                        if (uVar17 == 0x7c000726) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1d3];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000725) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1d4];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000727) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1d5];
                          goto LAB_00114a1c;
                        }
                        if (uVar17 == 0x7c000724) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar31 = (byte)(uVar33 >> 0xb);
                          bVar13 = (byte)(uVar33 >> 0x15);
                          pvVar18 = local_38[0x1d6];
                          goto LAB_00114a1c;
                        }
                        if (uVar34 == 0x6c02007c) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          pvVar18 = local_38[0x1d7];
                          goto LAB_00114bc6;
                        }
                        if (uVar17 == 0x7c0007a4) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_78,
                                     (size_type)
                                     (local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          uVar16 = (ushort)(uVar33 >> 0xb);
                          pvVar18 = local_38[0x1d8];
                          goto LAB_00114a93;
                        }
                        if (uVar17 != 0x7c000008) {
                          if (uVar7 == 0xc000000) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_78,
                                       (size_type)
                                       (local_78.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar31 = (byte)(uVar33 >> 0x15);
                            pvVar18 = local_38[0x1da];
                            goto LAB_00114cb7;
                          }
                          if (uVar28 == 0x7c000106) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_78,
                                       (size_type)
                                       (local_78.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar14 = (byte)(uVar33 >> 0x15);
                            pvVar18 = local_38[0x1db];
                            goto LAB_00114b63;
                          }
                          if (uVar34 == 0x4601007c) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_78,
                                       (size_type)
                                       (local_78.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            pvVar18 = local_38[0x1dd];
                          }
                          else {
                            if (uVar34 != 0x4681007c) {
                              if (uVar17 == 0x7c000279) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_78,
                                           (size_type)
                                           (local_78.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar31 = (byte)(uVar33 >> 0xb);
                                bVar13 = (byte)(uVar33 >> 0x15);
                                pvVar18 = local_38[0x1de];
                              }
                              else {
                                if (uVar17 != 0x7c000278) {
                                  if (uVar7 == 0x6c000000) {
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_78,
                                           (size_type)
                                           (local_78.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                    bVar31 = (byte)(uVar33 >> 0x15);
                                    pvVar18 = local_38[0x1e0];
                                  }
                                  else {
                                    if (uVar7 != 0x68000000) {
                                      if (uVar34 != 0x18) {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cerr,
                                                   "Unimplemented instruction ",0x1a);
                                        p_Var35 = local_58;
                                        *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
                                             *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)
                                                      ) & 0xffffffb5 | 8;
                                        poVar12 = std::ostream::_M_insert<unsigned_long>
                                                            ((ulong)&std::cerr);
                                        std::endl<char,std::char_traits<char>>(poVar12);
                                        unimplemented(this,"unknown during translation",addr);
                                        goto LAB_0010d916;
                                      }
                                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                      resize(&local_78,
                                             (size_type)
                                             (local_78.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (8 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                      pvVar18 = local_38[0x1e2];
                                      goto LAB_00114cf7;
                                    }
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_78,
                                           (size_type)
                                           (local_78.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                    bVar31 = (byte)(uVar33 >> 0x15);
                                    pvVar18 = local_38[0x1e1];
                                  }
                                  goto LAB_00114cb7;
                                }
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_78,
                                           (size_type)
                                           (local_78.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar31 = (byte)(uVar33 >> 0xb);
                                bVar13 = (byte)(uVar33 >> 0x15);
                                pvVar18 = local_38[0x1df];
                              }
                              goto LAB_0010df05;
                            }
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_78,
                                       (size_type)
                                       (local_78.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_78.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            pvVar18 = local_38[0x1dc];
                          }
                          goto LAB_00114bc6;
                        }
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_78,
                                   (size_type)
                                   (local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_78.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        *(void **)(local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -0x10) =
                             local_38[0x1d9];
                        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-7] =
                             (byte)(uVar33 >> 0x15) & 0x1f;
                        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-8] = (byte)(uVar33 >> 0xf) & 0x3f
                        ;
                        bVar31 = (byte)(uVar33 >> 0xb) & 0xf;
                        goto LAB_0010df1a;
                      }
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_78,
                                 (size_type)
                                 (local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_78.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      *(void **)(local_78.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x10) =
                           local_38[0x111];
                      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-8] = (byte)(uVar33 >> 0x17) & 7;
                      bVar13 = (byte)(uVar33 >> 0x12) & 7;
                      goto LAB_0010dc39;
                    }
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_78,
                               (size_type)
                               (local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_78.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar31 = (byte)(uVar33 >> 0x15);
                    pvVar18 = local_38[0xbc];
LAB_00113e24:
                    *(void **)(local_78.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-2] = bVar31 & 0x1f;
                    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1] = bVar14 & 0x1f;
                    uVar16 = (ushort)(uVar2 >> 4);
                    goto LAB_0010e25a;
                  }
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_78,
                             (size_type)
                             (local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_78.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar14 = (byte)(uVar33 >> 0xb);
                  bVar31 = (byte)(uVar33 >> 0x15);
                  pvVar18 = local_38[0xa5];
LAB_001104db:
                  *(void **)(local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish[-4] = bVar31 & 0x1f;
                  goto LAB_0010dd25;
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_78,
                           (size_type)
                           (local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar13 = (byte)(uVar33 >> 0xb);
                bVar14 = (byte)(uVar33 >> 0x15);
                pvVar18 = local_38[0x78];
LAB_00111732:
                *(void **)(local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish + -0x10) = pvVar18;
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish[-8] = bVar14 & 0x1f;
                goto LAB_0010dc39;
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_78,
                         (size_type)
                         (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_78.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar31 = (byte)(uVar33 >> 0x17);
              pvVar18 = local_38[0x40];
LAB_0010e6fb:
              *(void **)(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish[-5] = bVar31 & 7;
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish[-6] = bVar14 & 0x1f;
              goto LAB_0010db3d;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_78,
                       (size_type)
                       (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            bVar31 = (byte)(uVar33 >> 0x15);
            pvVar18 = local_38[0x18];
LAB_0010dd16:
            *(void **)(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
            bVar31 = bVar31 & 0x1f;
LAB_0010dd1e:
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish[-4] = bVar31;
            bVar14 = bVar14 & 0x1f;
LAB_0010dd25:
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish[-3] = bVar14;
LAB_0010dd28:
            *(uint32_t *)
             (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish + -8) = addr;
            bVar26 = false;
            p_Var35 = local_58;
            goto LAB_0010d91c;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_78,
                     (size_type)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar31 = (byte)(uVar33 >> 0x15);
          pvVar18 = local_38[0x11];
LAB_0010db2d:
          *(void **)(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish[-6] = bVar31 & 0x1f;
          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish[-5] = bVar14 & 0x1f;
LAB_0010db3d:
          *(undefined2 *)
           (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish + -8) = uVar32;
          p_Var35 = local_58;
          goto LAB_0010d916;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_78,
                   (size_type)
                   (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_78.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar31 = (byte)(uVar33 >> 0xb);
        bVar13 = (byte)(uVar33 >> 0x15);
        pvVar18 = local_38[0xc];
LAB_0010da0a:
        *(void **)(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar18;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish[-4] = bVar13 & 0x1f;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish[-3] = bVar14 & 0x1f;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish[-2] = bVar31 & 0x1f;
        *(uint32_t *)
         (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish + -8) = addr;
        bVar26 = false;
      }
LAB_0010d91c:
    } while (bVar26);
    pVar44 = std::
             _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::_M_emplace<unsigned_int&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       (p_Var35,&local_3c,&local_78);
    p_Var11 = *(_Hash_node_base **)
               ((long)pVar44.first.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                      ._M_cur.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
               + 0x10);
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    p_Var11 = p_Var11[2]._M_nxt;
  }
  return (uint8_t *)p_Var11;
}

Assistant:

uint8_t *PowerCore::fetchBlock(uint32_t blockAddr)
{
    auto it = blocks.find(blockAddr);
    if(it != blocks.end())
    {
        //std::cout << "Again at " << std::hex << blockAddr << std::endl;
        return it->second.data();
    }
    std::vector<uint8_t> block;

    //std::cout << "First time at " << std::hex << blockAddr << std::endl;

    auto allocOpcode = [&](unsigned sz) {
        block.resize(block.size() + sz);
        return block.data() + block.size() - sz;
    };

    uint32_t breakpoint = 0xFFFFFFFF;
    if(getNextBreakpoint)
        breakpoint = getNextBreakpoint(blockAddr);

    void ** opcodes;
    interpret2(&opcodes);
    auto makeOpcode = [opcodes](int idx) { return opcodes[idx]; };

    uint32_t addr = blockAddr;
    for(;;)
    {
        if(addr == breakpoint)
        {
            Opcode_breakpoint& translated = *reinterpret_cast<Opcode_breakpoint*>(allocOpcode(sizeof(Opcode_breakpoint)));
            translated.opcode = makeOpcode(-1);
            translated.CIA = addr;
            breakpoint = getNextBreakpoint(addr + 4);
        }
        uint32_t insn = load<uint32_t>(addr);
        if(false)
            ;
#include "generated.translate.h"
        else
        {
            std::cerr << "Unimplemented instruction " << std::hex << insn << std::endl;
            unimplemented("unknown during translation", addr);
        }
        addr += 4;
    }